

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.h
# Opt level: O3

void __thiscall pbrt::BDPTIntegrator::~BDPTIntegrator(BDPTIntegrator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pFVar2;
  pointer pcVar3;
  
  (this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator._vptr_Integrator =
       (_func_int **)&PTR__BDPTIntegrator_0309de08;
  pFVar2 = (this->weightFilms).
           super__Vector_base<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pFVar2 != (pointer)0x0) {
    operator_delete(pFVar2,(long)(this->weightFilms).
                                 super__Vector_base<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pFVar2);
  }
  pcVar3 = (this->lightSampleStrategy)._M_dataplus._M_p;
  paVar1 = &(this->lightSampleStrategy).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  Integrator::~Integrator((Integrator *)this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

BDPTIntegrator(CameraHandle camera, SamplerHandle sampler, PrimitiveHandle aggregate,
                   std::vector<LightHandle> lights, int maxDepth,
                   bool visualizeStrategies, bool visualizeWeights,
                   const std::string &lightSampleStrategy = "power",
                   bool regularize = false)
        : RayIntegrator(camera, sampler, aggregate, lights),
          maxDepth(maxDepth),
          visualizeStrategies(visualizeStrategies),
          visualizeWeights(visualizeWeights),
          lightSampleStrategy(lightSampleStrategy),
          lightSampler(new PowerLightSampler(lights, Allocator())),
          regularize(regularize) {}